

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

void stb__arith_putbyte(stb_arith *a,int byte)

{
  int iVar1;
  
  iVar1 = a->pending_ffs;
  if (iVar1 == 0) {
    if (byte == 0xff) {
      a->pending_ffs = 1;
    }
    else {
      (*a->output->putbyte)(a->output,a->buffered_u8);
      a->buffered_u8 = byte;
    }
  }
  else if (iVar1 == -1) {
    if (byte == 0xff) {
      (*a->output->putbyte)(a->output,0xff);
      return;
    }
    a->buffered_u8 = byte;
    a->pending_ffs = 0;
  }
  else if (byte == 0xff) {
    a->pending_ffs = iVar1 + 1;
  }
  else {
    (*a->output->putbyte)(a->output,a->buffered_u8);
    if (0 < a->pending_ffs) {
      iVar1 = 0;
      do {
        (*a->output->putbyte)(a->output,0xff);
        iVar1 = iVar1 + 1;
      } while (iVar1 < a->pending_ffs);
    }
  }
  return;
}

Assistant:

static void stb__arith_putbyte(stb_arith *a, int byte)
{
   if (a->pending_ffs) {
      if (a->pending_ffs == -1) { // means no buffered data; encoded for fast path efficiency
         if (byte == 0xff)
            stb_putc(a->output, byte); // just write it immediately
         else {
            a->buffered_u8 = byte;
            a->pending_ffs = 0;
         }
      } else if (byte == 0xff) {
         ++a->pending_ffs;
      } else {
         int i;
         stb_putc(a->output, a->buffered_u8);
         for (i=0; i < a->pending_ffs; ++i)
            stb_putc(a->output, 0xff);
      }
   } else if (byte == 0xff) {
      ++a->pending_ffs;
   } else {
      // fast path
      stb_putc(a->output, a->buffered_u8);
      a->buffered_u8 = byte;
   }
}